

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O2

int __thiscall
asio::detail::reactive_socket_service_base::listen
          (reactive_socket_service_base *this,int __fd,int __n)

{
  int *in_RCX;
  undefined4 in_register_00000034;
  
  socket_ops::listen((socket_ops *)(ulong)*(uint *)CONCAT44(in_register_00000034,__fd),__n,
                     (int)in_RCX);
  return *in_RCX;
}

Assistant:

asio::error_code listen(base_implementation_type& impl,
      int backlog, asio::error_code& ec)
  {
    socket_ops::listen(impl.socket_, backlog, ec);
    return ec;
  }